

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2e8af7c::PeerManagerImpl::ProcessInvalidTx
          (PeerManagerImpl *this,NodeId nodeid,CTransactionRef *ptx,TxValidationState *state,
          bool maybe_add_extra_compact_tx)

{
  TxValidationResult TVar1;
  element_type *peVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pvVar5;
  pointer puVar6;
  pointer puVar7;
  uint uVar8;
  bool bVar9;
  int iVar10;
  const_iterator it_2;
  Logger *pLVar11;
  CRollingBloomFilter *pCVar12;
  pointer pCVar13;
  ulong uVar14;
  ulong uVar15;
  pointer pCVar16;
  ulong uVar17;
  const_iterator it_1;
  pointer pvVar18;
  long lVar19;
  ulong uVar21;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  PeerRef PVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  NodeId nodeid_local;
  string local_98;
  PeerRef peer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [40];
  ulong uVar20;
  
  local_58._32_8_ = *(long *)(in_FS_OFFSET + 0x28);
  nodeid_local = nodeid;
  pLVar11 = LogInstance();
  bVar9 = BCLog::Logger::WillLogCategoryLevel(pLVar11,MEMPOOLREJ,Debug);
  if (bVar9) {
    base_blob<256u>::ToString_abi_cxx11_
              ((string *)local_58,
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                hash);
    base_blob<256u>::ToString_abi_cxx11_
              ((string *)&peer,
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x911b71;
    ValidationState<TxValidationResult>::ToString_abi_cxx11_
              (&local_98,&state->super_ValidationState<TxValidationResult>);
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
    ;
    source_file._M_len = 0x5b;
    logging_function._M_str = "ProcessInvalidTx";
    logging_function._M_len = 0x10;
    LogPrintf_<std::__cxx11::string,std::__cxx11::string,long,std::__cxx11::string>
              (logging_function,source_file,0xc96,MEMPOOLREJ,0xfca243,(char *)local_58,
               (string *)&peer,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nodeid_local,
               (long *)&local_98,pbVar23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != &local_68) {
      operator_delete(peer.
                      super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,local_68._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_,CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
    }
  }
  TVar1 = (state->super_ValidationState<TxValidationResult>).m_result;
  if (TVar1 != TX_MISSING_INPUTS) {
    if (TVar1 != TX_WITNESS_STRIPPED) {
      if (TVar1 == TX_RECONSIDERABLE) {
        pCVar12 = RecentRejectsReconsiderableFilter(this);
      }
      else {
        pCVar12 = RecentRejectsFilter(this);
      }
      vKey.m_data = &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->m_witness_hash;
      vKey.m_size = 0x20;
      CRollingBloomFilter::insert(pCVar12,vKey);
      TxRequestTracker::ForgetTxHash
                (&this->m_txrequest,
                 &(((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   )->m_witness_hash).m_wrapped);
      if (((state->super_ValidationState<TxValidationResult>).m_result == TX_INPUTS_NOT_STANDARD) &&
         (((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          m_has_witness == true)) {
        pCVar12 = RecentRejectsFilter(this);
        vKey_00.m_data =
             &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              hash;
        vKey_00.m_size = 0x20;
        CRollingBloomFilter::insert(pCVar12,vKey_00);
        TxRequestTracker::ForgetTxHash
                  (&this->m_txrequest,
                   &(((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->hash).m_wrapped);
      }
      if (maybe_add_extra_compact_tx) {
        peVar2 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        pCVar13 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar15 = 0;
        pCVar4 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        uVar17 = (long)pCVar3 + (0x1f - (long)pCVar13) & 0xfffffffffffffff0;
        if (pCVar3 == pCVar13) {
          uVar17 = uVar15;
        }
        pCVar16 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = (long)pCVar4 + (0x1f - (long)pCVar16) & 0xfffffffffffffff0;
        if (pCVar4 == pCVar16) {
          uVar14 = uVar15;
        }
        uVar14 = uVar14 + uVar17;
        for (; pCVar16 !=
               (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish; pCVar16 = pCVar16 + 1) {
          pvVar5 = *(pointer *)
                    ((long)&(pCVar16->scriptWitness).stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data + 0x10);
          pvVar18 = (pCVar16->scriptWitness).stack.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar17 = (long)pvVar5 + (0x1f - (long)pvVar18) & 0xfffffffffffffff0;
          if (pvVar5 == pvVar18) {
            uVar17 = uVar15;
          }
          uVar21 = (ulong)(pCVar16->scriptSig).super_CScriptBase._union.indirect_contents.capacity;
          if ((pCVar16->scriptSig).super_CScriptBase._size < 0x1d) {
            uVar21 = uVar15;
          }
          uVar20 = uVar21 + 0x1f & 0x1fffffff0;
          if ((int)uVar21 == 0) {
            uVar20 = uVar15;
          }
          lVar19 = uVar20 + uVar17;
          for (; pvVar18 !=
                 *(pointer *)
                  ((long)&(pCVar16->scriptWitness).stack.
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data + 8); pvVar18 = pvVar18 + 1) {
            puVar6 = (pvVar18->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar7 = (pvVar18->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar17 = 0;
            if (puVar6 != puVar7) {
              uVar17 = (ulong)(puVar6 + (0x1f - (long)puVar7)) & 0xfffffffffffffff0;
            }
            lVar19 = lVar19 + uVar17;
          }
          uVar14 = uVar14 + lVar19;
        }
        for (; pCVar13 !=
               (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_finish; pCVar13 = pCVar13 + 1) {
          uVar8 = (pCVar13->scriptPubKey).super_CScriptBase._union.indirect_contents.capacity;
          if ((pCVar13->scriptPubKey).super_CScriptBase._size < 0x1d) {
            uVar8 = 0;
          }
          uVar17 = 0;
          if (uVar8 != 0) {
            uVar17 = (ulong)uVar8 + 0x1f & 0x1fffffff0;
          }
          uVar14 = uVar14 + uVar17;
        }
        if (uVar14 < 100000) {
          AddToCompactExtraTransactions(this,ptx);
        }
      }
    }
    PVar22 = GetPeerRef((PeerManagerImpl *)&peer,(NodeId)this);
    if (((state->super_ValidationState<TxValidationResult>).m_result == TX_CONSENSUS) &&
       (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0)) {
      local_58._8_8_ = NODE_NONE;
      local_58[0x10] = '\0';
      local_58._0_8_ = local_58 + 0x10;
      Misbehaving((PeerManagerImpl *)
                  peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,(Peer *)local_58,
                  (string *)
                  PVar22.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi._M_pi);
      if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
        operator_delete((void *)local_58._0_8_,CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
      }
    }
    if (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (((state->super_ValidationState<TxValidationResult>).m_result != TX_MISSING_INPUTS) &&
       (iVar10 = TxOrphanage::EraseTx
                           (&this->m_orphanage,
                            &((ptx->
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->m_witness_hash), 0 < iVar10)) {
      pLVar11 = LogInstance();
      bVar9 = BCLog::Logger::WillLogCategoryLevel(pLVar11,TXPACKAGES,Debug);
      if (bVar9) {
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)local_58,
                   &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->hash);
        pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x911ea3;
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)&peer,
                   &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_witness_hash);
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_00._M_len = 0x5b;
        logging_function_00._M_str = "ProcessInvalidTx";
        logging_function_00._M_len = 0x10;
        ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,0xcc9,TXPACKAGES,0xfca274,(char *)local_58,
                   (string *)&peer,pbVar23);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr != &local_68) {
          operator_delete(peer.
                          super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_68._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
          operator_delete((void *)local_58._0_8_,CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_58._32_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessInvalidTx(NodeId nodeid, const CTransactionRef& ptx, const TxValidationState& state,
                                       bool maybe_add_extra_compact_tx)
{
    AssertLockNotHeld(m_peer_mutex);
    AssertLockHeld(g_msgproc_mutex);
    AssertLockHeld(m_tx_download_mutex);

    LogDebug(BCLog::MEMPOOLREJ, "%s (wtxid=%s) from peer=%d was not accepted: %s\n",
        ptx->GetHash().ToString(),
        ptx->GetWitnessHash().ToString(),
        nodeid,
        state.ToString());

    if (state.GetResult() == TxValidationResult::TX_MISSING_INPUTS) {
        return;
    } else if (state.GetResult() != TxValidationResult::TX_WITNESS_STRIPPED) {
        // We can add the wtxid of this transaction to our reject filter.
        // Do not add txids of witness transactions or witness-stripped
        // transactions to the filter, as they can have been malleated;
        // adding such txids to the reject filter would potentially
        // interfere with relay of valid transactions from peers that
        // do not support wtxid-based relay. See
        // https://github.com/bitcoin/bitcoin/issues/8279 for details.
        // We can remove this restriction (and always add wtxids to
        // the filter even for witness stripped transactions) once
        // wtxid-based relay is broadly deployed.
        // See also comments in https://github.com/bitcoin/bitcoin/pull/18044#discussion_r443419034
        // for concerns around weakening security of unupgraded nodes
        // if we start doing this too early.
        if (state.GetResult() == TxValidationResult::TX_RECONSIDERABLE) {
            // If the result is TX_RECONSIDERABLE, add it to m_lazy_recent_rejects_reconsiderable
            // because we should not download or submit this transaction by itself again, but may
            // submit it as part of a package later.
            RecentRejectsReconsiderableFilter().insert(ptx->GetWitnessHash().ToUint256());
        } else {
            RecentRejectsFilter().insert(ptx->GetWitnessHash().ToUint256());
        }
        m_txrequest.ForgetTxHash(ptx->GetWitnessHash());
        // If the transaction failed for TX_INPUTS_NOT_STANDARD,
        // then we know that the witness was irrelevant to the policy
        // failure, since this check depends only on the txid
        // (the scriptPubKey being spent is covered by the txid).
        // Add the txid to the reject filter to prevent repeated
        // processing of this transaction in the event that child
        // transactions are later received (resulting in
        // parent-fetching by txid via the orphan-handling logic).
        // We only add the txid if it differs from the wtxid, to avoid wasting entries in the
        // rolling bloom filter.
        if (state.GetResult() == TxValidationResult::TX_INPUTS_NOT_STANDARD && ptx->HasWitness()) {
            RecentRejectsFilter().insert(ptx->GetHash().ToUint256());
            m_txrequest.ForgetTxHash(ptx->GetHash());
        }
        if (maybe_add_extra_compact_tx && RecursiveDynamicUsage(*ptx) < 100000) {
            AddToCompactExtraTransactions(ptx);
        }
    }

    MaybePunishNodeForTx(nodeid, state);

    // If the tx failed in ProcessOrphanTx, it should be removed from the orphanage unless the
    // tx was still missing inputs. If the tx was not in the orphanage, EraseTx does nothing and returns 0.
    if (Assume(state.GetResult() != TxValidationResult::TX_MISSING_INPUTS) && m_orphanage.EraseTx(ptx->GetWitnessHash()) > 0) {
        LogDebug(BCLog::TXPACKAGES, "   removed orphan tx %s (wtxid=%s)\n", ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString());
    }
}